

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O0

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options(App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator iVar4;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  __first;
  iterator __pred;
  long in_RSI;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_RDI;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *options;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffee8;
  function<bool_(const_CLI::Option_*)> *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_ffffffffffffff10;
  
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::size((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          *)(in_RSI + 0xd8));
  std::allocator<const_CLI::Option_*>::allocator((allocator<const_CLI::Option_*> *)0x114819);
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<const_CLI::Option_*>::~allocator((allocator<const_CLI::Option_*> *)0x11483c);
  cVar2 = ::std::
          begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                    ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)in_stack_fffffffffffffee8);
  cVar3 = ::std::
          end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                    ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)in_stack_fffffffffffffee8);
  iVar4 = ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                    (in_stack_fffffffffffffee8);
  __first = ::std::
            transform<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                      (cVar2._M_current,cVar3._M_current,iVar4._M_current);
  bVar1 = ::std::function::operator_cast_to_bool(in_stack_fffffffffffffef0);
  if (bVar1) {
    iVar4 = ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                      (in_stack_fffffffffffffee8);
    __pred = ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                       (in_stack_fffffffffffffee8);
    ::std::
    remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>
              (__first,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                        )iVar4._M_current,(anon_class_8_1_552cbcb6_for__M_pred)__pred._M_current);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<const_CLI::Option_*const_*,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffee8);
    ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
              (in_stack_fffffffffffffee8);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<const_CLI::Option_*const_*,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffee8);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::erase
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               __pred._M_current,(const_iterator)__first._M_current,(const_iterator)iVar4._M_current
              );
  }
  return in_RDI;
}

Assistant:

std::vector<const Option *> get_options(const std::function<bool(const Option *)> filter = {}) const {
        std::vector<const Option *> options(options_.size());
        std::transform(std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) {
            return val.get();
        });

        if(filter) {
            options.erase(std::remove_if(std::begin(options),
                                         std::end(options),
                                         [&filter](const Option *opt) { return !filter(opt); }),
                          std::end(options));
        }

        return options;
    }